

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O2

void __thiscall
flatbuffers::lobster::LobsterGenerator::GenStructPreDecl
          (LobsterGenerator *this,StructDef *struct_def,string *code_ptr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  if ((struct_def->super_Definition).generated == false) {
    CheckNameSpace(this,&struct_def->super_Definition,code_ptr);
    EscapeKeyword(&local_40,this,(string *)struct_def);
    std::operator+(&local_80,"class ",&local_40);
    std::operator+(&local_60,&local_80,"\n\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void GenStructPreDecl(const StructDef &struct_def, std::string *code_ptr) {
    if (struct_def.generated) return;
    std::string &code = *code_ptr;
    CheckNameSpace(struct_def, &code);
    code += "class " + NormalizedName(struct_def) + "\n\n";
  }